

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetObjectNumberU64(JlDataObject *NumberObject,uint64_t *pNumber64)

{
  JL_STATUS local_1c;
  JL_STATUS jlStatus;
  uint64_t *pNumber64_local;
  JlDataObject *NumberObject_local;
  
  if ((NumberObject == (JlDataObject *)0x0) || (pNumber64 == (uint64_t *)0x0)) {
    local_1c = JL_STATUS_INVALID_PARAMETER;
  }
  else if ((NumberObject->Type == JL_DATA_TYPE_NUMBER) &&
          ((NumberObject->field_2).Number.Type == JL_NUM_TYPE_UNSIGNED)) {
    *pNumber64 = (uint64_t)(NumberObject->field_2).Number.field_1;
    local_1c = JL_STATUS_SUCCESS;
  }
  else if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
    *pNumber64 = 0;
    local_1c = JL_STATUS_VALUE_OUT_OF_RANGE;
  }
  else {
    *pNumber64 = 0;
    local_1c = JL_STATUS_WRONG_TYPE;
  }
  return local_1c;
}

Assistant:

JL_STATUS
    JlGetObjectNumberU64
    (
        JlDataObject const* NumberObject,
        uint64_t*           pNumber64
    )
{
    JL_STATUS jlStatus;

    if(     NULL != NumberObject
        &&  NULL != pNumber64 )
    {
        if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_UNSIGNED == NumberObject->Number.Type )
        {
            // Positive integers will always be stored as unsigned, even if they were added as signed number
            *pNumber64 = NumberObject->Number.u64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if( JL_DATA_TYPE_NUMBER == NumberObject->Type )
        {
            // Wrong type of number
            *pNumber64 = 0;
            jlStatus = JL_STATUS_VALUE_OUT_OF_RANGE;
        }
        else
        {
            *pNumber64 = 0;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}